

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool cmakeCheckStampFile(string *stampName)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  undefined1 local_650 [8];
  ofstream stamp;
  string stampTemp;
  ostringstream stampTempStream;
  int local_2b4;
  undefined1 local_2b0 [4];
  int result;
  string dep;
  cmFileTimeCache ftc;
  long local_250;
  ifstream fin;
  undefined1 local_38 [8];
  string stampDepends;
  string *stampName_local;
  
  stampDepends.field_2._8_8_ = stampName;
  std::__cxx11::string::string((string *)local_38,(string *)stampName);
  std::__cxx11::string::operator+=((string *)local_38,".depend");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_250,pcVar4,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_250 + *(long *)(local_250 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    std::__cxx11::string::string((string *)local_2b0);
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&local_250,(string *)local_2b0,(bool *)0x0,-1);
      if (!bVar2) {
        bVar2 = false;
        goto LAB_0039cdb5;
      }
      uVar5 = std::__cxx11::string::empty();
    } while ((((uVar5 & 1) != 0) ||
             (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_2b0), *pcVar4 == '#'))
            || ((bVar2 = cmFileTimeCache::Compare
                                   ((cmFileTimeCache *)((long)&dep.field_2 + 8),(string *)local_38,
                                    (string *)local_2b0,&local_2b4), bVar2 && (-1 < local_2b4))));
    poVar6 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar6 = std::operator<<(poVar6,(string *)stampDepends.field_2._8_8_);
    std::operator<<(poVar6," is out-of-date.\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  the file \'");
    poVar6 = std::operator<<(poVar6,(string *)local_2b0);
    std::operator<<(poVar6,"\'\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  is newer than \'");
    poVar6 = std::operator<<(poVar6,(string *)local_38);
    std::operator<<(poVar6,"\'\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"  result=\'");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_2b4);
    std::operator<<(poVar6,"\'\n");
    stampName_local._7_1_ = 0;
    bVar2 = true;
LAB_0039cdb5:
    std::__cxx11::string::~string((string *)local_2b0);
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)((long)&dep.field_2 + 8));
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
      poVar6 = std::operator<<((ostream *)((long)&stampTemp.field_2 + 8),
                               (string *)stampDepends.field_2._8_8_);
      poVar6 = std::operator<<(poVar6,".tmp");
      uVar3 = cmSystemTools::RandomSeed();
      std::ostream::operator<<(poVar6,uVar3);
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_650,pcVar4,_S_out);
      std::operator<<((ostream *)local_650,"# CMake generation timestamp file for this directory.\n"
                     );
      std::ofstream::~ofstream(local_650);
      stampName_local._7_1_ =
           cmSystemTools::RenameFile
                     ((string *)&stamp.field_0x1f8,(string *)stampDepends.field_2._8_8_);
      if (!(bool)stampName_local._7_1_) {
        cmsys::SystemTools::RemoveFile((string *)&stamp.field_0x1f8);
        std::operator+(&local_670,"Cannot restore timestamp ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       stampDepends.field_2._8_8_);
        cmSystemTools::Error(&local_670);
        std::__cxx11::string::~string((string *)&local_670);
      }
      std::__cxx11::string::~string((string *)&stamp.field_0x1f8);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)(stampTemp.field_2._M_local_buf + 8));
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"CMake is re-running because ");
    poVar6 = std::operator<<(poVar6,(string *)stampDepends.field_2._8_8_);
    std::operator<<(poVar6," dependency file is missing.\n");
    stampName_local._7_1_ = 0;
  }
  std::ifstream::~ifstream(&local_250);
  std::__cxx11::string::~string((string *)local_38);
  return (bool)(stampName_local._7_1_ & 1);
}

Assistant:

static bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = stampName;
  stampDepends += ".depend";
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n";
        std::cout << "  the file '" << dep << "'\n";
        std::cout << "  is newer than '" << stampDepends << "'\n";
        std::cout << "  result='" << result << "'\n";
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  if (cmSystemTools::RenameFile(stampTemp, stampName)) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error("Cannot restore timestamp " + stampName);
  return false;
}